

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::AccessorEnumFieldGenerator::GenerateMembers
          (AccessorEnumFieldGenerator *this,Printer *printer,bool param_2)

{
  bool bVar1;
  bool param_2_local;
  Printer *printer_local;
  AccessorEnumFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,"private int $name$_;\n");
  bVar1 = Params::generate_intdefs((this->super_FieldGenerator).params_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"$message_type_intdef$\n");
  }
  io::Printer::Print(printer,&this->variables_,
                     "public int get$capitalized_name$() {\n  return $name$_;\n}\npublic $message_name$ set$capitalized_name$("
                    );
  bVar1 = Params::generate_intdefs((this->super_FieldGenerator).params_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,"\n    $message_type_intdef$ ");
  }
  io::Printer::Print(printer,&this->variables_,
                     "int value) {\n  $name$_ = value;\n  $set_has$;\n  return this;\n}\npublic boolean has$capitalized_name$() {\n  return $get_has$;\n}\npublic $message_name$ clear$capitalized_name$() {\n  $name$_ = $default$;\n  $clear_has$;\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void AccessorEnumFieldGenerator::
GenerateMembers(io::Printer* printer, bool /* unused lazy_init */) const {
  printer->Print(variables_, "private int $name$_;\n");
  if (params_.generate_intdefs()) {
    printer->Print(variables_, "$message_type_intdef$\n");
  }
  printer->Print(variables_,
    "public int get$capitalized_name$() {\n"
    "  return $name$_;\n"
    "}\n"
    "public $message_name$ set$capitalized_name$(");
  if (params_.generate_intdefs()) {
    printer->Print(variables_,
      "\n"
      "    $message_type_intdef$ ");
  }
  printer->Print(variables_,
    "int value) {\n"
    "  $name$_ = value;\n"
    "  $set_has$;\n"
    "  return this;\n"
    "}\n"
    "public boolean has$capitalized_name$() {\n"
    "  return $get_has$;\n"
    "}\n"
    "public $message_name$ clear$capitalized_name$() {\n"
    "  $name$_ = $default$;\n"
    "  $clear_has$;\n"
    "  return this;\n"
    "}\n");
}